

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Performance::anon_unknown_1::BufferInUseRenderTimeCase::runSample
          (BufferInUseRenderTimeCase *this,SampleResult *sample)

{
  int iVar1;
  DrawMethod DVar2;
  UploadRange UVar3;
  UploadMethod UVar4;
  RenderContext *context;
  char cVar5;
  int iVar6;
  deUint32 err;
  int iVar7;
  uint uVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ObjectTraits *pOVar10;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  deUint64 dVar11;
  deUint64 dVar12;
  void *__dest;
  Exception *this_00;
  undefined8 *puVar13;
  undefined8 uVar14;
  long lVar15;
  pointer __src;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indexData;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> vertexData;
  Surface resultSurface;
  Buffer alternativeUploadBuffer;
  Buffer indexBuffer;
  Buffer arrayBuffer;
  long local_110;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_108;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> local_e8;
  Surface local_c8;
  deUint64 local_b0;
  ObjectWrapper local_a8;
  TextureFormat local_90;
  ObjectWrapper local_88;
  ObjectWrapper local_70;
  PixelBufferAccess local_58;
  long lVar9;
  
  iVar6 = (*((this->
             super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
             ).super_RenderPerformanceTestBase.super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  lVar9 = CONCAT44(extraout_var,iVar6);
  iVar6 = (*((this->
             super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
             ).super_RenderPerformanceTestBase.super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  pOVar10 = glu::objectTraits(OBJECTTYPE_BUFFER);
  glu::ObjectWrapper::ObjectWrapper(&local_70,(Functions *)CONCAT44(extraout_var_00,iVar6),pOVar10);
  iVar6 = (*((this->
             super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
             ).super_RenderPerformanceTestBase.super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  pOVar10 = glu::objectTraits(OBJECTTYPE_BUFFER);
  glu::ObjectWrapper::ObjectWrapper(&local_88,(Functions *)CONCAT44(extraout_var_01,iVar6),pOVar10);
  iVar6 = (*((this->
             super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
             ).super_RenderPerformanceTestBase.super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  pOVar10 = glu::objectTraits(OBJECTTYPE_BUFFER);
  glu::ObjectWrapper::ObjectWrapper(&local_a8,(Functions *)CONCAT44(extraout_var_02,iVar6),pOVar10);
  iVar6 = (sample->scene).gridWidth;
  iVar7 = (sample->scene).gridHeight;
  iVar1 = (sample->scene).gridLayers;
  tcu::Surface::Surface(&local_c8,0x80,0x80);
  local_e8.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e8.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  generateLayeredGridVertexAttribData4C4V(&local_e8,&sample->scene);
  if ((this->
      super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
      ).m_drawMethod == DRAWMETHOD_DRAW_ELEMENTS) {
    generateLayeredGridIndexData(&local_108,&sample->scene);
  }
  (**(code **)(lVar9 + 0x40))(0x8892,local_70.m_object);
  (**(code **)(lVar9 + 0x40))(0x8893,local_88.m_object);
  RenderPerformanceTestBase::setupVertexAttribs((RenderPerformanceTestBase *)this);
  iVar6 = iVar6 * iVar7 * iVar1 * 6;
  DVar2 = (this->
          super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
          ).m_drawMethod;
  if (DVar2 == DRAWMETHOD_DRAW_ELEMENTS) {
    (**(code **)(lVar9 + 0x150))
              (0x8892,(long)local_e8.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_e8.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
               local_e8.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start,0x88e0);
    (**(code **)(lVar9 + 0x150))
              (0x8893,(long)local_108.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)local_108.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start,
               local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start,0x88e0);
    (**(code **)(lVar9 + 0x568))(4,iVar6,0x1405,0);
  }
  else if (DVar2 == DRAWMETHOD_DRAW_ARRAYS) {
    (**(code **)(lVar9 + 0x150))
              (0x8892,(long)local_e8.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_e8.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
               local_e8.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start,0x88e0);
    (**(code **)(lVar9 + 0x538))(4,0,iVar6);
  }
  if (this->m_uploadBufferTarget == UPLOADBUFFERTARGET_DIFFERENT_BUFFER) {
    iVar7 = *(int *)&(this->
                     super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
                     ).field_0xcc;
    if (iVar7 == 1) {
      (**(code **)(lVar9 + 0x40))(0x8893,local_a8.m_object);
      (**(code **)(lVar9 + 0x150))
                (0x8893,(long)local_108.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)local_108.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                 local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start,0x88e0);
      (**(code **)(lVar9 + 0x568))(4,iVar6,0x1405,0);
    }
    else if (iVar7 == 0) {
      (**(code **)(lVar9 + 0x40))(0x8892,local_a8.m_object);
      (**(code **)(lVar9 + 0x150))
                (0x8892,(long)local_e8.
                              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_e8.
                              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                 local_e8.
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_start,0x88e0);
      RenderPerformanceTestBase::setupVertexAttribs((RenderPerformanceTestBase *)this);
      (**(code **)(lVar9 + 0x538))(4,0,iVar6);
    }
    (**(code **)(lVar9 + 0x40))(0x8892,local_70.m_object);
    (**(code **)(lVar9 + 0x40))(0x8893,local_88.m_object);
    RenderPerformanceTestBase::setupVertexAttribs((RenderPerformanceTestBase *)this);
  }
  RenderPerformanceTestBase::waitGLResults((RenderPerformanceTestBase *)this);
  err = (**(code **)(lVar9 + 0x800))();
  glu::checkError(err,"post buffer prepare",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/performance/es3pBufferDataUploadTests.cpp"
                  ,0x1468);
  (**(code **)(lVar9 + 0x1c0))(0,0,0,0x3f800000);
  (**(code **)(lVar9 + 0x188))(0x4000);
  RenderPerformanceTestBase::waitGLResults((RenderPerformanceTestBase *)this);
  tcu::warmupCPU();
  dVar11 = deGetMicroseconds();
  DVar2 = (this->
          super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
          ).m_drawMethod;
  if (DVar2 == DRAWMETHOD_DRAW_ELEMENTS) {
    (**(code **)(lVar9 + 0x568))(4,iVar6,0x1405,0);
  }
  else if (DVar2 == DRAWMETHOD_DRAW_ARRAYS) {
    (**(code **)(lVar9 + 0x538))(4,0,iVar6);
  }
  dVar12 = deGetMicroseconds();
  (sample->result).duration.firstRenderDuration = dVar12 - dVar11;
  uVar8 = *(uint *)&(this->
                    super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
                    ).field_0xcc;
  UVar3 = this->m_uploadRange;
  if (uVar8 == 0 && UVar3 == UPLOADRANGE_FULL) {
    lVar15 = (long)local_e8.
                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_e8.
                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    uVar14 = 0x8892;
    __src = local_e8.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start;
LAB_01348f63:
    local_110 = 0;
  }
  else {
    if ((uVar8 ^ 1) == 0 && UVar3 == UPLOADRANGE_FULL) {
      lVar15 = (long)local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start;
      uVar14 = 0x8893;
      __src = (pointer)local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start;
      goto LAB_01348f63;
    }
    if (uVar8 == 0 && (UVar3 ^ UPLOADRANGE_PARTIAL) == UPLOADRANGE_FULL) {
      iVar7 = (int)local_e8.
                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
              (int)local_e8.
                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
      lVar15 = (long)(int)(iVar7 >> 1 & 0xfffffff8);
      local_110 = (long)(int)(iVar7 >> 2 & 0xfffffffc);
      __src = (pointer)((long)(local_e8.
                               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->m_data + local_110);
      uVar14 = 0x8892;
    }
    else {
      if ((uVar8 ^ 1) != 0 || (UVar3 ^ UPLOADRANGE_PARTIAL) != UPLOADRANGE_FULL) goto LAB_0134917a;
      uVar8 = ((int)local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
               (int)local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 1 & 0xfffffffeU) + 3 & 0xfffffffc;
      lVar15 = (long)(int)uVar8;
      local_110 = (long)(int)(((int)uVar8 >> 1) + 3U & 0xfffffffc);
      __src = (pointer)((long)(float *)local_108.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_start + local_110);
      uVar14 = 0x8893;
    }
  }
  if (this->m_uploadBufferTarget == UPLOADBUFFERTARGET_DIFFERENT_BUFFER) {
    (**(code **)(lVar9 + 0x40))(uVar14,local_a8.m_object);
  }
  local_b0 = deGetMicroseconds();
  UVar4 = this->m_uploadMethod;
  if (UVar4 == UPLOADMETHOD_MAP_BUFFER_RANGE) {
    uVar8 = 10;
    if (this->m_mapFlags != MAPFLAG_INVALIDATE_BUFFER) {
      uVar8 = -(uint)(this->m_mapFlags != MAPFLAG_INVALIDATE_RANGE) | 6;
    }
    __dest = (void *)(**(code **)(lVar9 + 0xd00))(uVar14,local_110,lVar15,uVar8);
    if (__dest == (void *)0x0) {
      this_00 = (Exception *)__cxa_allocate_exception(0x30);
      local_58.super_ConstPixelBufferAccess.m_format =
           (TextureFormat)(local_58.super_ConstPixelBufferAccess.m_size.m_data + 2);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_58,"MapBufferRange returned NULL","");
      tcu::Exception::Exception(this_00,(string *)&local_58);
      __cxa_throw(this_00,&tcu::Exception::typeinfo,tcu::Exception::~Exception);
    }
    memcpy(__dest,__src,(long)(int)lVar15);
    cVar5 = (**(code **)(lVar9 + 0x1670))(uVar14);
    if (cVar5 == '\0') {
      puVar13 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar13 = &PTR__exception_0215a088;
      __cxa_throw(puVar13,&Performance::(anonymous_namespace)::UnmapFailureError::typeinfo,
                  std::exception::~exception);
    }
  }
  else if (UVar4 == UPLOADMETHOD_BUFFER_SUB_DATA) {
    (**(code **)(lVar9 + 0x168))(uVar14,local_110,lVar15,__src);
  }
  else if (UVar4 == UPLOADMETHOD_BUFFER_DATA) {
    (**(code **)(lVar9 + 0x150))(uVar14,lVar15,__src,0x88e0);
  }
  dVar11 = deGetMicroseconds();
  (sample->result).uploadedDataSize = (int)lVar15;
  (sample->result).duration.uploadDuration = dVar11 - local_b0;
  if (*(int *)&(this->
               super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
               ).field_0xcc == 0 &&
      this->m_uploadBufferTarget == UPLOADBUFFERTARGET_DIFFERENT_BUFFER) {
    RenderPerformanceTestBase::setupVertexAttribs((RenderPerformanceTestBase *)this);
  }
  dVar11 = deGetMicroseconds();
  DVar2 = (this->
          super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
          ).m_drawMethod;
  if (DVar2 == DRAWMETHOD_DRAW_ELEMENTS) {
    (**(code **)(lVar9 + 0x568))(4,iVar6,0x1405,0);
  }
  else if (DVar2 == DRAWMETHOD_DRAW_ARRAYS) {
    (**(code **)(lVar9 + 0x538))(4,0,iVar6);
  }
  dVar12 = deGetMicroseconds();
  (sample->result).duration.secondRenderDuration = dVar12 - dVar11;
  dVar11 = deGetMicroseconds();
  context = ((this->
             super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
             ).super_RenderPerformanceTestBase.super_TestCase.m_context)->m_renderCtx;
  local_90.order = RGBA;
  local_90.type = UNORM_INT8;
  if ((void *)local_c8.m_pixels.m_cap != (void *)0x0) {
    local_c8.m_pixels.m_cap = (size_t)local_c8.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            (&local_58,&local_90,local_c8.m_width,local_c8.m_height,1,
             (void *)local_c8.m_pixels.m_cap);
  glu::readPixels(context,0,0,&local_58);
  dVar12 = deGetMicroseconds();
  (sample->result).duration.readDuration = dVar12 - dVar11;
  (sample->result).renderDataSize = (sample->result).numVertices << 5;
  dVar11 = (dVar12 - dVar11) + (sample->result).duration.secondRenderDuration;
  (sample->result).duration.renderReadDuration = dVar11;
  (sample->result).duration.totalDuration =
       (sample->result).duration.firstRenderDuration + dVar11 +
       (sample->result).duration.uploadDuration;
  (sample->result).duration.fitResponseDuration = dVar11;
LAB_0134917a:
  if ((pointer)local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_e8.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e8.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_e8.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  tcu::Surface::~Surface(&local_c8);
  glu::ObjectWrapper::~ObjectWrapper(&local_a8);
  glu::ObjectWrapper::~ObjectWrapper(&local_88);
  glu::ObjectWrapper::~ObjectWrapper(&local_70);
  return;
}

Assistant:

void BufferInUseRenderTimeCase::runSample (SampleResult& sample)
{
	const glw::Functions&	gl						= m_context.getRenderContext().getFunctions();
	const glu::Buffer		arrayBuffer				(m_context.getRenderContext());
	const glu::Buffer		indexBuffer				(m_context.getRenderContext());
	const glu::Buffer		alternativeUploadBuffer	(m_context.getRenderContext());
	const int				numVertices				= getLayeredGridNumVertices(sample.scene);
	tcu::Surface			resultSurface			(RENDER_AREA_SIZE, RENDER_AREA_SIZE);
	deUint64				startTime;
	deUint64				endTime;
	std::vector<tcu::Vec4>	vertexData;
	std::vector<deUint32>	indexData;

	// create data

	generateLayeredGridVertexAttribData4C4V(vertexData, sample.scene);
	if (m_drawMethod == DRAWMETHOD_DRAW_ELEMENTS)
		generateLayeredGridIndexData(indexData, sample.scene);

	// make buffers used

	gl.bindBuffer(GL_ARRAY_BUFFER, *arrayBuffer);
	gl.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, *indexBuffer);
	setupVertexAttribs();

	if (m_drawMethod == DRAWMETHOD_DRAW_ARRAYS)
	{
		gl.bufferData(GL_ARRAY_BUFFER, (glw::GLsizeiptr)(vertexData.size() * sizeof(tcu::Vec4)), &vertexData[0], GL_STREAM_DRAW);
		gl.drawArrays(GL_TRIANGLES, 0, numVertices);
	}
	else if (m_drawMethod == DRAWMETHOD_DRAW_ELEMENTS)
	{
		gl.bufferData(GL_ARRAY_BUFFER, (glw::GLsizeiptr)(vertexData.size() * sizeof(tcu::Vec4)), &vertexData[0], GL_STREAM_DRAW);
		gl.bufferData(GL_ELEMENT_ARRAY_BUFFER, (glw::GLsizeiptr)(indexData.size() * sizeof(deUint32)), &indexData[0], GL_STREAM_DRAW);
		gl.drawElements(GL_TRIANGLES, numVertices, GL_UNSIGNED_INT, DE_NULL);
	}
	else
		DE_ASSERT(false);

	// another pair of buffers for reference case
	if (m_uploadBufferTarget == UPLOADBUFFERTARGET_DIFFERENT_BUFFER)
	{
		if (m_targetBuffer == TARGETBUFFER_VERTEX)
		{
			gl.bindBuffer(GL_ARRAY_BUFFER, *alternativeUploadBuffer);
			gl.bufferData(GL_ARRAY_BUFFER, (glw::GLsizeiptr)(vertexData.size() * sizeof(tcu::Vec4)), &vertexData[0], GL_STREAM_DRAW);

			setupVertexAttribs();
			gl.drawArrays(GL_TRIANGLES, 0, numVertices);
		}
		else if (m_targetBuffer == TARGETBUFFER_INDEX)
		{
			gl.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, *alternativeUploadBuffer);
			gl.bufferData(GL_ELEMENT_ARRAY_BUFFER, (glw::GLsizeiptr)(indexData.size() * sizeof(deUint32)), &indexData[0], GL_STREAM_DRAW);
			gl.drawElements(GL_TRIANGLES, numVertices, GL_UNSIGNED_INT, DE_NULL);
		}
		else
			DE_ASSERT(false);

		// restore state
		gl.bindBuffer(GL_ARRAY_BUFFER, *arrayBuffer);
		gl.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, *indexBuffer);
		setupVertexAttribs();
	}

	waitGLResults();
	GLU_EXPECT_NO_ERROR(gl.getError(), "post buffer prepare");

	gl.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
	gl.clear(GL_COLOR_BUFFER_BIT);
	waitGLResults();

	tcu::warmupCPU();

	// first draw
	{
		startTime = deGetMicroseconds();

		if (m_drawMethod == DRAWMETHOD_DRAW_ARRAYS)
			gl.drawArrays(GL_TRIANGLES, 0, numVertices);
		else if (m_drawMethod == DRAWMETHOD_DRAW_ELEMENTS)
			gl.drawElements(GL_TRIANGLES, numVertices, GL_UNSIGNED_INT, DE_NULL);
		else
			DE_ASSERT(false);

		endTime = deGetMicroseconds();

		sample.result.duration.firstRenderDuration = endTime - startTime;
	}

	// upload
	{
		glw::GLenum		target;
		glw::GLsizeiptr	size;
		glw::GLintptr	offset = 0;
		const void*		source;

		if (m_targetBuffer == TARGETBUFFER_VERTEX && m_uploadRange == UPLOADRANGE_FULL)
		{
			target	= GL_ARRAY_BUFFER;
			size	= (glw::GLsizeiptr)(vertexData.size() * sizeof(tcu::Vec4));
			source	= &vertexData[0];
		}
		else if (m_targetBuffer == TARGETBUFFER_INDEX && m_uploadRange == UPLOADRANGE_FULL)
		{
			target	= GL_ELEMENT_ARRAY_BUFFER;
			size	= (glw::GLsizeiptr)(indexData.size() * sizeof(deUint32));
			source	= &indexData[0];
		}
		else if (m_targetBuffer == TARGETBUFFER_VERTEX && m_uploadRange == UPLOADRANGE_PARTIAL)
		{
			target	= GL_ARRAY_BUFFER;
			size	= (glw::GLsizeiptr)deAlign32((int)(vertexData.size() * sizeof(tcu::Vec4)) / 2, 4);
			offset	= (glw::GLintptr)deAlign32((int)size / 2, 4);
			source	= (const deUint8*)&vertexData[0] + offset;
		}
		else if (m_targetBuffer == TARGETBUFFER_INDEX && m_uploadRange == UPLOADRANGE_PARTIAL)
		{
			// upload to 25% - 75% range
			target	= GL_ELEMENT_ARRAY_BUFFER;
			size	= (glw::GLsizeiptr)deAlign32((deInt32)(indexData.size() * sizeof(deUint32)) / 2, 4);
			offset	= (glw::GLintptr)deAlign32((int)size / 2, 4);
			source	= (const deUint8*)&indexData[0] + offset;
		}
		else
		{
			DE_ASSERT(false);
			return;
		}

		// reference case? don't modify the buffer in use
		if (m_uploadBufferTarget == UPLOADBUFFERTARGET_DIFFERENT_BUFFER)
			gl.bindBuffer(target, *alternativeUploadBuffer);

		startTime = deGetMicroseconds();

		if (m_uploadMethod == UPLOADMETHOD_BUFFER_DATA)
			gl.bufferData(target, size, source, GL_STREAM_DRAW);
		else if (m_uploadMethod == UPLOADMETHOD_BUFFER_SUB_DATA)
			gl.bufferSubData(target, offset, size, source);
		else if (m_uploadMethod == UPLOADMETHOD_MAP_BUFFER_RANGE)
		{
			const int		mapFlags	= (m_mapFlags == MAPFLAG_INVALIDATE_BUFFER)	? (GL_MAP_WRITE_BIT | GL_MAP_INVALIDATE_BUFFER_BIT)	:
										  (m_mapFlags == MAPFLAG_INVALIDATE_RANGE)	? (GL_MAP_WRITE_BIT | GL_MAP_INVALIDATE_RANGE_BIT)	:
										  (-1);
			void*			mapPtr;
			glw::GLboolean	unmapSuccessful;

			mapPtr = gl.mapBufferRange(target, offset, size, mapFlags);
			if (!mapPtr)
				throw tcu::Exception("MapBufferRange returned NULL");

			deMemcpy(mapPtr, source, (int)size);

			// if unmapping fails, just try again later
			unmapSuccessful = gl.unmapBuffer(target);
			if (!unmapSuccessful)
				throw UnmapFailureError();
		}
		else
			DE_ASSERT(false);

		endTime = deGetMicroseconds();

		sample.result.uploadedDataSize = (int)size;
		sample.result.duration.uploadDuration = endTime - startTime;
	}

	// second draw
	{
		// Source vertex data from alternative buffer in refernce case
		if (m_uploadBufferTarget == UPLOADBUFFERTARGET_DIFFERENT_BUFFER && m_targetBuffer == TARGETBUFFER_VERTEX)
			setupVertexAttribs();

		startTime = deGetMicroseconds();

		if (m_drawMethod == DRAWMETHOD_DRAW_ARRAYS)
			gl.drawArrays(GL_TRIANGLES, 0, numVertices);
		else if (m_drawMethod == DRAWMETHOD_DRAW_ELEMENTS)
			gl.drawElements(GL_TRIANGLES, numVertices, GL_UNSIGNED_INT, DE_NULL);
		else
			DE_ASSERT(false);

		endTime = deGetMicroseconds();

		sample.result.duration.secondRenderDuration = endTime - startTime;
	}

	// read
	{
		startTime = deGetMicroseconds();
		glu::readPixels(m_context.getRenderContext(), 0, 0, resultSurface.getAccess());
		endTime = deGetMicroseconds();

		sample.result.duration.readDuration = endTime - startTime;
	}

	// set results

	sample.result.renderDataSize = getVertexDataSize() * sample.result.numVertices;

	sample.result.duration.renderReadDuration	= sample.result.duration.secondRenderDuration + sample.result.duration.readDuration;
	sample.result.duration.totalDuration		= sample.result.duration.firstRenderDuration +
												  sample.result.duration.uploadDuration +
												  sample.result.duration.secondRenderDuration +
												  sample.result.duration.readDuration;
	sample.result.duration.fitResponseDuration	= sample.result.duration.renderReadDuration;
}